

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NGramStorageTest.cpp
# Opt level: O0

void __thiscall
ngram_storage_check_content_check_Test::TestBody(ngram_storage_check_content_check_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  AssertHelper *this_00;
  AssertHelper *pAVar4;
  reference this_01;
  Message *pMVar5;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  int j_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ngram_2;
  int i_2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint32_t j_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ngram_1;
  uint32_t i_1;
  NGramStorage storage2;
  NGramStorage storage;
  int j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ngram;
  int i;
  vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
  ngrams;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>
  *in_stack_fffffffffffffba8;
  NGramStorage *in_stack_fffffffffffffbb0;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  uint32_t in_stack_fffffffffffffbc0;
  uint32_t in_stack_fffffffffffffbc4;
  vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  uint32_t in_stack_fffffffffffffbd4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  uint32_t in_stack_fffffffffffffc00;
  uint32_t in_stack_fffffffffffffc04;
  NGramStorage *in_stack_fffffffffffffc08;
  Message *in_stack_fffffffffffffc28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffc48;
  vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffffc50;
  AssertionResult local_388 [3];
  uint32_t local_350;
  uint32_t local_34c;
  AssertionResult local_348 [3];
  uint32_t local_310;
  uint32_t local_30c;
  AssertionResult local_308;
  int local_2f8;
  int local_2f4;
  int local_2d4;
  string *in_stack_fffffffffffffd48;
  Serializable *in_stack_fffffffffffffd50;
  AssertionResult local_2a0 [3];
  uint32_t local_268;
  uint32_t local_264;
  AssertionResult local_260;
  uint local_24c;
  uint32_t local_220;
  uint32_t local_21c;
  AssertionResult local_218;
  uint local_204;
  uint local_1e4;
  string local_1e0 [320];
  long local_a0;
  int local_48;
  int local_44;
  int local_24;
  vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
  local_20;
  
  std::
  vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
            *)0x10aefc);
  for (local_24 = 0; local_24 < 10000; local_24 = local_24 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10af25);
    for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
      uVar3 = prng();
      local_48 = (int)uVar3 + (int)(uVar3 / 0x1a) * -0x1a;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffbb0,
                 (value_type *)in_stack_fffffffffffffba8);
    }
    uVar3 = prng();
    local_a0 = uVar3 + 1 + (uVar3 / 5 & 0xfffffffffffffffe) * -5;
    std::make_pair<std::vector<unsigned_int,std::allocator<unsigned_int>>&,unsigned_long>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               (unsigned_long *)in_stack_fffffffffffffbb0);
    std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>::
    pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_true>
              ((pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int> *)
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    std::
    vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
    ::push_back((vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                 *)in_stack_fffffffffffffbb0,(value_type *)in_stack_fffffffffffffba8);
    std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>::~pair
              ((pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int> *)
               0x10b059);
    std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>::~pair
              ((pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long> *)
               0x10b066);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  }
  NGramStorage::NGramStorage
            ((NGramStorage *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             in_stack_fffffffffffffbc8);
  NGramStorage::NGramStorage
            ((NGramStorage *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  Serializable::dumps_abi_cxx11_((Serializable *)in_stack_fffffffffffffd48);
  Serializable::loads(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_1e0);
  local_1e4 = 0;
  while( true ) {
    this_00 = (AssertHelper *)(ulong)local_1e4;
    pAVar4 = (AssertHelper *)
             std::
             vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
             ::size(&local_20);
    if (pAVar4 <= this_00) break;
    std::
    vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
    ::operator[](&local_20,(ulong)local_1e4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
    local_204 = 0;
    while( true ) {
      in_stack_fffffffffffffc28 = (Message *)(ulong)local_204;
      this_01 = std::
                vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                ::operator[](&local_20,(ulong)local_1e4);
      pMVar5 = (Message *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_01->first);
      if (pMVar5 <= in_stack_fffffffffffffc28) break;
      local_21c = NGramStorage::get_ngram_count
                            (in_stack_fffffffffffffc08,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      local_220 = get_ngram_count((vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                  in_stack_fffffffffffffbd8);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((char *)in_stack_fffffffffffffbc8,
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 (uint *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 (uint *)in_stack_fffffffffffffbb0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        testing::AssertionResult::failure_message((AssertionResult *)0x10b38c);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                   (Type)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffffc28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
        testing::Message::~Message((Message *)0x10b3e9);
      }
      local_24c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b457);
      if (local_24c != 0) goto LAB_0010b8a4;
      local_264 = NGramStorage::get_continuations_count
                            (in_stack_fffffffffffffc08,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      local_268 = get_continuations_count
                            ((vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                              *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                             in_stack_fffffffffffffbd8);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((char *)in_stack_fffffffffffffbc8,
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 (uint *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 (uint *)in_stack_fffffffffffffbb0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        in_stack_fffffffffffffc08 =
             (NGramStorage *)testing::AssertionResult::failure_message((AssertionResult *)0x10b58a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                   (Type)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffffc28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
        testing::Message::~Message((Message *)0x10b5e7);
      }
      local_24c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b655);
      if (local_24c != 0) goto LAB_0010b8a4;
      in_stack_fffffffffffffc04 =
           NGramStorage::get_unique_continuations_count
                     (in_stack_fffffffffffffc08,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      in_stack_fffffffffffffc00 =
           get_unique_continuations_count(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((char *)in_stack_fffffffffffffbc8,
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 (uint *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 (uint *)in_stack_fffffffffffffbb0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a0);
      in_stack_fffffffffffffbff = bVar1;
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        testing::AssertionResult::failure_message((AssertionResult *)0x10b792);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                   (Type)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffffc28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
        testing::Message::~Message((Message *)0x10b7ef);
      }
      local_24c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b85a);
      if (local_24c != 0) goto LAB_0010b8a4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10b874);
      local_204 = local_204 + 1;
    }
    local_24c = 0;
LAB_0010b8a4:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    if (local_24c != 0) goto LAB_0010bffc;
    local_1e4 = local_1e4 + 1;
  }
  for (local_2d4 = 0; local_2d4 < 10000; local_2d4 = local_2d4 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10b915);
    for (local_2f4 = 0; local_2f4 < 3; local_2f4 = local_2f4 + 1) {
      uVar3 = prng();
      local_2f8 = (int)uVar3 + (int)(uVar3 / 0x1a) * -0x1a;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffbb0,
                 (value_type *)in_stack_fffffffffffffba8);
      uVar2 = NGramStorage::get_ngram_count
                        (in_stack_fffffffffffffc08,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      local_30c = uVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      local_310 = get_ngram_count((vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                                   *)CONCAT44(uVar2,in_stack_fffffffffffffbe0),
                                  in_stack_fffffffffffffbd8);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((char *)in_stack_fffffffffffffbc8,
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 (uint *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 (uint *)in_stack_fffffffffffffbb0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
      in_stack_fffffffffffffbe0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbe0);
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT44(uVar2,in_stack_fffffffffffffbe0));
        in_stack_fffffffffffffbd8 =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x10baa3);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffbe0),
                   (Type)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffffc28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
        testing::Message::~Message((Message *)0x10bb00);
      }
      local_24c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bb6e);
      if (local_24c != 0) goto LAB_0010bfb0;
      in_stack_fffffffffffffbd4 =
           NGramStorage::get_continuations_count
                     (in_stack_fffffffffffffc08,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      local_34c = in_stack_fffffffffffffbd4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      local_350 = get_continuations_count
                            ((vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                              *)CONCAT44(uVar2,in_stack_fffffffffffffbe0),in_stack_fffffffffffffbd8)
      ;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((char *)in_stack_fffffffffffffbc8,
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 (uint *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 (uint *)in_stack_fffffffffffffbb0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_348);
      in_stack_fffffffffffffbd0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbd0);
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT44(uVar2,in_stack_fffffffffffffbe0));
        in_stack_fffffffffffffbc8 =
             (vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0x10bca1);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffbe0),
                   (Type)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffffc28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
        testing::Message::~Message((Message *)0x10bcfe);
      }
      local_24c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bd6c);
      if (local_24c != 0) goto LAB_0010bfb0;
      in_stack_fffffffffffffbc4 =
           NGramStorage::get_unique_continuations_count
                     (in_stack_fffffffffffffc08,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      in_stack_fffffffffffffbc0 =
           get_unique_continuations_count(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((char *)in_stack_fffffffffffffbc8,
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 (uint *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 (uint *)in_stack_fffffffffffffbb0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_388);
      in_stack_fffffffffffffbbf = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT44(uVar2,in_stack_fffffffffffffbe0));
        in_stack_fffffffffffffbb0 =
             (NGramStorage *)testing::AssertionResult::failure_message((AssertionResult *)0x10bea9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffbe0),
                   (Type)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffffc28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
        testing::Message::~Message((Message *)0x10bf06);
      }
      local_24c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bf71);
      if (local_24c != 0) goto LAB_0010bfb0;
    }
    local_24c = 0;
LAB_0010bfb0:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    if (local_24c != 0) goto LAB_0010bffc;
  }
  local_24c = 0;
LAB_0010bffc:
  NGramStorage::~NGramStorage(in_stack_fffffffffffffbb0);
  NGramStorage::~NGramStorage(in_stack_fffffffffffffbb0);
  std::
  vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
             *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  return;
}

Assistant:

TEST(ngram_storage_check, content_check) {
    vector<pair<vector<uint32_t>, uint32_t>> ngrams;

    for (int i = 0; i < 10000; i++) {
        vector<uint32_t> ngram;
        for (int j = 0; j < 3; j++)
            ngram.push_back(uint32_t(prng() % 26));
        ngrams.push_back(make_pair(ngram, prng() % 10 + 1));
    }

    NGramStorage storage(ngrams);
    NGramStorage storage2;
    storage2.loads(storage.dumps());

    for (uint32_t i = 0; i < ngrams.size(); i++) {
        vector<uint32_t> ngram = ngrams[i].first;
        for (uint32_t j = 0; j < ngrams[i].first.size(); j++) {
            ASSERT_EQ(storage2.get_ngram_count(ngram), get_ngram_count(ngrams, ngram));
            ASSERT_EQ(storage2.get_continuations_count(ngram), get_continuations_count(ngrams, ngram));
            ASSERT_EQ(storage2.get_unique_continuations_count(ngram), get_unique_continuations_count(ngrams, ngram));
            ngram.pop_back();
        }
    }

    for (int i = 0; i < 10000; i++) {
        vector<uint32_t> ngram;
        for (int j = 0; j < 3; j++) {
            ngram.push_back(uint32_t(prng() % 26));
            ASSERT_EQ(storage2.get_ngram_count(ngram), get_ngram_count(ngrams, ngram));
            ASSERT_EQ(storage2.get_continuations_count(ngram), get_continuations_count(ngrams, ngram));
            ASSERT_EQ(storage2.get_unique_continuations_count(ngram), get_unique_continuations_count(ngrams, ngram));
        }
    }
}